

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void cmGlobalNinjaGenerator::WriteComment(ostream *os,string *comment)

{
  long lVar1;
  ostream *poVar2;
  string local_50 [32];
  
  if (comment->_M_string_length != 0) {
    std::operator<<(os,"\n#############################################\n");
    while( true ) {
      lVar1 = std::__cxx11::string::find((char)comment,10);
      poVar2 = std::operator<<(os,"# ");
      if (lVar1 == -1) break;
      std::__cxx11::string::substr((ulong)local_50,(ulong)comment);
      poVar2 = std::operator<<(poVar2,local_50);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string(local_50);
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)comment);
    poVar2 = std::operator<<(poVar2,local_50);
    std::operator<<(poVar2,"\n\n");
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenBuildFileStreams()
{
  if (!this->OpenFileStream(this->BuildFileStream,
                            cmGlobalNinjaGenerator::NINJA_BUILD_FILE)) {
    return false;
  }

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n";

  return true;
}